

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_constraints.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  long *returnvalue;
  long *returnvalue_00;
  void *returnvalue_01;
  void *returnvalue_02;
  void *returnvalue_03;
  void *returnvalue_04;
  long *plVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  int retval;
  SUNContext sunctx;
  double local_c0;
  int retvalr;
  void *local_b0;
  int rootsfound [2];
  void *local_98;
  sunrealtype t;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  undefined4 local_44;
  long nge;
  long nfeLS;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar7 = 1;
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    returnvalue = (long *)N_VNew_Serial(3,sunctx);
    iVar3 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0;
      puVar1[2] = 0;
      returnvalue_00 = (long *)N_VNew_Serial(3,sunctx);
      iVar3 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        puVar2 = *(undefined4 **)(*returnvalue_00 + 0x10);
        *puVar2 = 0xa0b5ed8d;
        puVar2[1] = 0x3eb0c6f7;
        puVar2[2] = 0xe1796495;
        puVar2[3] = 0x3da5fd7f;
        *(undefined8 *)(puVar2 + 4) = 0x3ee4f8b588e368f1;
        returnvalue_01 = (void *)N_VNew_Serial(3,sunctx);
        iVar3 = check_retval(returnvalue_01,"N_VNew_Serial",0);
        if (iVar3 == 0) {
          N_VConst(0,returnvalue_01);
          returnvalue_02 = (void *)CVodeCreate(2,sunctx);
          local_98 = returnvalue_02;
          iVar3 = check_retval(returnvalue_02,"CVodeCreate",0);
          if (iVar3 == 0) {
            retval = CVodeInit(0,returnvalue_02,f,returnvalue);
            iVar3 = check_retval(&retval,"CVodeInit",1);
            iVar7 = 1;
            if (iVar3 == 0) {
              retval = CVodeSVtolerances(0xeb1c432d,returnvalue_02,returnvalue_00);
              iVar3 = check_retval(&retval,"CVodeSVtolerances",1);
              iVar7 = 1;
              if (iVar3 == 0) {
                retval = CVodeRootInit(returnvalue_02,2,g);
                iVar7 = 1;
                iVar3 = check_retval(&retval,"CVodeRootInit",1);
                if (iVar3 == 0) {
                  returnvalue_03 = (void *)SUNDenseMatrix(3,3,sunctx);
                  iVar3 = check_retval(returnvalue_03,"SUNDenseMatrix",0);
                  if (iVar3 == 0) {
                    returnvalue_04 = (void *)SUNLinSol_Dense(returnvalue,returnvalue_03,sunctx);
                    local_b0 = returnvalue_03;
                    iVar3 = check_retval(returnvalue_04,"SUNLinSol_Dense",0);
                    if (iVar3 == 0) {
                      retval = CVodeSetLinearSolver(returnvalue_02,returnvalue_04,local_b0);
                      iVar3 = check_retval(&retval,"CVodeSetLinearSolver",1);
                      iVar7 = 1;
                      if (iVar3 == 0) {
                        retval = CVodeSetJacFn(returnvalue_02,Jac);
                        iVar3 = check_retval(&retval,"CVodeSetJacFn",1);
                        iVar7 = 1;
                        if (iVar3 == 0) {
                          retval = CVodeSetConstraints(returnvalue_02,returnvalue_01);
                          iVar3 = check_retval(&retval,"CVodeSetConstraints",1);
                          iVar7 = 1;
                          if (iVar3 == 0) {
                            N_VDestroy(returnvalue_01);
                            puts(" \n3-species kinetics problem\n");
                            local_c0 = 0.4;
                            iVar7 = 0;
                            do {
                              retval = CVode(SUB84(local_c0,0),returnvalue_02,returnvalue,&t,1);
                              puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                              printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n",SUB84(t,0),
                                     *puVar1,puVar1[1],puVar1[2]);
                              if (retval == 2) {
                                retvalr = CVodeGetRootInfo(returnvalue_02,rootsfound);
                                iVar3 = check_retval(&retvalr,"CVodeGetRootInfo",1);
                                if (iVar3 != 0) {
                                  return 1;
                                }
                                printf("    rootsfound[] = %3d %3d\n",(ulong)(uint)rootsfound[0],
                                       (ulong)(uint)rootsfound[1]);
                              }
                              iVar3 = check_retval(&retval,"CVode",1);
                              if (iVar3 != 0) break;
                              dVar8 = local_c0 * 10.0;
                              if (retval != 0) {
                                dVar8 = local_c0;
                              }
                              iVar7 = iVar7 + (uint)(retval == 0);
                              local_c0 = dVar8;
                            } while (iVar7 != 0xc);
                            local_44 = CVodeGetNumSteps(returnvalue_02,&nst);
                            check_retval(&local_44,"CVodeGetNumSteps",1);
                            local_44 = CVodeGetNumRhsEvals(returnvalue_02,&nfe);
                            check_retval(&local_44,"CVodeGetNumRhsEvals",1);
                            local_44 = CVodeGetNumLinSolvSetups(returnvalue_02,&nsetups);
                            check_retval(&local_44,"CVodeGetNumLinSolvSetups",1);
                            local_44 = CVodeGetNumErrTestFails(returnvalue_02,&netf);
                            check_retval(&local_44,"CVodeGetNumErrTestFails",1);
                            local_44 = CVodeGetNumNonlinSolvIters(returnvalue_02,&nni);
                            check_retval(&local_44,"CVodeGetNumNonlinSolvIters",1);
                            local_44 = CVodeGetNumNonlinSolvConvFails(returnvalue_02,&nnf);
                            check_retval(&local_44,"CVodeGetNumNonlinSolvConvFails",1);
                            local_44 = CVodeGetNumStepSolveFails(returnvalue_02,&ncfn);
                            check_retval(&local_44,"CVodeGetNumStepSolveFails",1);
                            local_44 = CVodeGetNumJacEvals(returnvalue_02,&nje);
                            check_retval(&local_44,"CVodeGetNumJacEvals",1);
                            local_44 = CVodeGetNumLinRhsEvals(returnvalue_02,&nfeLS);
                            check_retval(&local_44,"CVodeGetNumLinRhsEvals",1);
                            local_44 = CVodeGetNumGEvals(returnvalue_02);
                            check_retval(&local_44,"CVodeGetNumGEvals",1);
                            puts("\nFinal Statistics:");
                            printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n"
                                   ,nst,nfe,nsetups,nfeLS,nje);
                            printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld  nge = %ld\n\n"
                                   ,nni,nnf,netf,ncfn,nge);
                            plVar4 = (long *)N_VClone(returnvalue);
                            uVar5 = N_VClone(returnvalue);
                            puVar2 = *(undefined4 **)(*plVar4 + 0x10);
                            *puVar2 = 0x19675e2c;
                            puVar2[1] = 0x3e6bf64d;
                            puVar2[2] = 0xeff51f97;
                            puVar2[3] = 0x3d4d5205;
                            *(undefined8 *)(puVar2 + 4) = 0x3fefffffe409aba4;
                            N_VAbs(plVar4,uVar5);
                            N_VLinearSum(0xeb1c432d,uVar5,returnvalue_00,uVar5);
                            dVar8 = (double)N_VMin(uVar5);
                            if (dVar8 <= 0.0) {
                              fwrite("\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n",0x2e,1,
                                     _stderr);
                              uVar6 = 0xffffffff;
                            }
                            else {
                              N_VInv(uVar5,uVar5);
                              N_VLinearSum(0,0xbff0000000000000,returnvalue,plVar4,plVar4);
                              dVar8 = (double)N_VWrmsNorm(plVar4,uVar5);
                              if (1.0 <= dVar8) {
                                fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
                              }
                              uVar6 = (uint)(1.0 <= dVar8);
                              N_VDestroy(plVar4);
                              N_VDestroy(uVar5);
                            }
                            retval = uVar6;
                            N_VDestroy(returnvalue);
                            N_VDestroy(returnvalue_00);
                            CVodeFree(&local_98);
                            SUNLinSolFree(returnvalue_04);
                            SUNMatDestroy(local_b0);
                            SUNContext_Free(&sunctx);
                            iVar7 = retval;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  N_Vector abstol;
  N_Vector constraints;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  int retvalr;
  int rootsfound[2];

  y           = NULL;
  abstol      = NULL;
  constraints = NULL;
  A           = NULL;
  LS          = NULL;
  cvode_mem   = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Set the vector absolute tolerance */
  abstol = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)abstol, "N_VNew_Serial", 0)) { return (1); }

  Ith(abstol, 1) = ATOL1;
  Ith(abstol, 2) = ATOL2;
  Ith(abstol, 3) = ATOL3;

  /* Set constraints to all 1's for nonnegative solution values. */
  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  N_VConst(ONE, constraints);

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSVtolerances to specify the scalar relative tolerance
   * and vector absolute tolerances */
  retval = CVodeSVtolerances(cvode_mem, RTOL, abstol);
  if (check_retval(&retval, "CVodeSVtolerances", 1)) { return (1); }

  /* Call CVodeRootInit to specify the root function g with 2 components */
  retval = CVodeRootInit(cvode_mem, 2, g);
  if (check_retval(&retval, "CVodeRootInit", 1)) { return (1); }

  /* Create dense SUNMatrix */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Call CVodeSetConstraints to initialize constraints */
  retval = CVodeSetConstraints(cvode_mem, constraints);
  if (check_retval(&retval, "CVodeSetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */
  printf(" \n3-species kinetics problem\n\n");

  iout = 0;
  tout = T1;
  while (1)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, Ith(y, 1), Ith(y, 2), Ith(y, 3));

    if (retval == CV_ROOT_RETURN)
    {
      retvalr = CVodeGetRootInfo(cvode_mem, rootsfound);
      if (check_retval(&retvalr, "CVodeGetRootInfo", 1)) { return (1); }
      PrintRootInfo(rootsfound[0], rootsfound[1]);
    }

    if (check_retval(&retval, "CVode", 1)) { break; }
    if (retval == CV_SUCCESS)
    {
      iout++;
      tout *= TMULT;
    }

    if (iout == NOUT) { break; }
  }

  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* check the solution error */
  retval = check_ans(y, t, RTOL, abstol);

  /* Free memory */
  N_VDestroy(y);            /* Free y vector */
  N_VDestroy(abstol);       /* Free abstol vector */
  CVodeFree(&cvode_mem);    /* Free CVODE memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (retval);
}